

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Volume.cpp
# Opt level: O2

void __thiscall imrt::Volume::Volume(Volume *this,Collimator *collimator,string *deposition_file)

{
  _Rb_tree_header *p_Var1;
  string local_30;
  
  this->collimator = collimator;
  p_Var1 = &(this->D)._M_t._M_impl.super__Rb_tree_header;
  (this->D)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->D)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->D)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->D)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->D)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  std::__cxx11::string::string((string *)&local_30,(string *)deposition_file);
  set_data(this,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

Volume::Volume(Collimator& collimator, string deposition_file) :
		collimator(collimator) {
  set_data(deposition_file);
}